

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

optional<uint256> * __thiscall ChainstateManager::SnapshotBlockhash(ChainstateManager *this)

{
  bool bVar1;
  char *in_RSI;
  optional<uint256> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  char *pszFile;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28);
  pszFile = in_RSI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,pszFile,
             in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  if ((*(long *)(in_RSI + 0x10) == 0) ||
     (bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffffb8),
     !bVar1)) {
    std::optional<uint256>::optional(in_RDI);
  }
  else {
    memcpy(in_RDI,(void *)(*(long *)(in_RSI + 0x10) + 0x70),0x21);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::optional<uint256> ChainstateManager::SnapshotBlockhash() const
{
    LOCK(::cs_main);
    if (m_active_chainstate && m_active_chainstate->m_from_snapshot_blockhash) {
        // If a snapshot chainstate exists, it will always be our active.
        return m_active_chainstate->m_from_snapshot_blockhash;
    }
    return std::nullopt;
}